

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccs_test.cpp
# Opt level: O2

void __thiscall
CcsTest_TemplateGetters_Test::~CcsTest_TemplateGetters_Test(CcsTest_TemplateGetters_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CcsTest, TemplateGetters) {
  CcsDomain ccs;
  std::istringstream input("a = 3; b = 0x10");
  ccs.loadCcsStream(input, "<literal>", ImportResolver::None);
  CcsContext ctx = ccs.build();
  Foo foo = ctx.get<Foo>("a");
  EXPECT_EQ(3, foo.x);
  ASSERT_TRUE(ctx.getInto(foo, "b"));
  EXPECT_EQ(16, foo.x);
}